

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void check_type_duplication
               (c2m_ctx_t c2m_ctx,type *type,node_t_conflict n,char *name,int size,int sign)

{
  pos_t pVar1;
  
  if ((type->mode == TM_BASIC) && ((type->u).basic_type == TP_UNDEF)) {
    return;
  }
  pVar1 = get_node_pos(c2m_ctx,n);
  error(c2m_ctx,0x1c1b8f,pVar1.fname,pVar1._8_8_,name);
  return;
}

Assistant:

static void check_type_duplication (c2m_ctx_t c2m_ctx, struct type *type, node_t n,
                                    const char *name, int size, int sign) {
  if (type->mode != TM_BASIC || type->u.basic_type != TP_UNDEF)
    error (c2m_ctx, POS (n), "%s with another type", name);
  else if (type->mode != TM_BASIC && size != 0)
    error (c2m_ctx, POS (n), "size with non-numeric type");
  else if (type->mode != TM_BASIC && sign != 0)
    error (c2m_ctx, POS (n), "sign attribute with non-integer type");
}